

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O0

void __thiscall
OpenMD::NameFinder::matchInternalIndex
          (NameFinder *this,string *name,int internalIndex,SelectionSet *bs)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  Atom *this_00;
  RigidBody *this_01;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *in_RCX;
  int in_EDX;
  SimInfo *in_RDI;
  int nrigidbodies;
  int natoms;
  Molecule *mol;
  MoleculeIterator mi;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  Molecule *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  NameFinder *this_02;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  NameFinder local_50;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *local_20;
  int local_14;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator
            ((_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> *)
             &local_50.root_.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_50.root_.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       SimInfo::beginMolecule
                 (in_RDI,(MoleculeIterator *)
                         CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  while ((Molecule *)
         local_50.root_.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (Molecule *)0x0) {
    this_02 = &local_50;
    Molecule::getType_abi_cxx11_
              ((Molecule *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    bVar1 = isMatched(this_02,in_stack_ffffffffffffff78,(string *)in_stack_ffffffffffffff70);
    std::__cxx11::string::~string((string *)&local_50);
    if ((bVar1 & 1) != 0) {
      sVar3 = Molecule::getNAtoms((Molecule *)0x3f566f);
      iVar2 = (int)sVar3;
      sVar3 = Molecule::getNRigidBodies((Molecule *)0x3f567d);
      if (local_14 < iVar2 + (int)sVar3) {
        if (local_14 < iVar2) {
          in_stack_ffffffffffffff78 =
               (string *)
               std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                         (local_20,0);
          this_00 = Molecule::getAtomAt(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
          StuntDouble::getGlobalIndex(&this_00->super_StuntDouble);
          OpenMDBitSet::setBitOn
                    ((OpenMDBitSet *)in_stack_ffffffffffffff70,
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        }
        else if (local_14 < iVar2 + (int)sVar3) {
          in_stack_ffffffffffffff70 =
               (Molecule *)
               std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                         (local_20,0);
          this_01 = Molecule::getRigidBodyAt(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
          StuntDouble::getGlobalIndex(&this_01->super_StuntDouble);
          OpenMDBitSet::setBitOn
                    ((OpenMDBitSet *)in_stack_ffffffffffffff70,
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        }
      }
    }
    local_50.root_.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         SimInfo::nextMolecule(in_RDI,(MoleculeIterator *)CONCAT17(bVar1,in_stack_ffffffffffffff88))
    ;
  }
  return;
}

Assistant:

void NameFinder::matchInternalIndex(const std::string& name,
                                      int internalIndex, SelectionSet& bs) {
    SimInfo::MoleculeIterator mi;
    Molecule* mol;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      if (isMatched(mol->getType(), name)) {
        int natoms       = mol->getNAtoms();
        int nrigidbodies = mol->getNRigidBodies();
        if (internalIndex >= natoms + nrigidbodies) {
          continue;
        } else if (internalIndex < natoms) {
          bs.bitsets_[STUNTDOUBLE].setBitOn(
              mol->getAtomAt(internalIndex)->getGlobalIndex());
          continue;
        } else if (internalIndex < natoms + nrigidbodies) {
          bs.bitsets_[STUNTDOUBLE].setBitOn(
              mol->getRigidBodyAt(internalIndex - natoms)->getGlobalIndex());
        }
      }
    }
  }